

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseSignedPackageInfoData(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  uint uVar4;
  char *pcVar5;
  iterator __first;
  UModelIndex local_1a0;
  UByteArray local_188;
  UByteArray local_168;
  CBString local_148;
  UByteArray local_130;
  CBString local_110;
  CBString local_f8;
  undefined1 local_e0 [8];
  CBString info;
  undefined1 local_b8 [8];
  UByteArray hash;
  CBString name;
  UByteArray module;
  CPD_EXT_SIGNED_PACKAGE_INFO_MODULE *moduleHeader;
  uint local_44;
  undefined1 local_40 [4];
  UINT32 offset;
  UByteArray body;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  body.d.field_2._8_8_ = index;
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    TreeModel::body((UByteArray *)local_40,this->model,(UModelIndex *)body.d.field_2._8_8_);
    local_44 = 0;
    while (uVar2 = UByteArray::size((UByteArray *)local_40), local_44 < uVar2) {
      pcVar5 = UByteArray::constData((UByteArray *)local_40);
      pcVar5 = pcVar5 + local_44;
      iVar3 = UByteArray::size((UByteArray *)local_40);
      if (iVar3 - local_44 < 0x14) break;
      UByteArray::UByteArray
                ((UByteArray *)&name.super_tagbstring.data,pcVar5,*(ushort *)(pcVar5 + 0xe) + 0x14);
      usprintf((CBString *)((long)&hash.d.field_2 + 8),"%.12s",pcVar5);
      UByteArray::UByteArray((UByteArray *)local_b8,pcVar5 + 0x14,(uint)*(ushort *)(pcVar5 + 0xe));
      __first = UByteArray::begin_abi_cxx11_((UByteArray *)local_b8);
      info.super_tagbstring.data = (uchar *)UByteArray::end_abi_cxx11_((UByteArray *)local_b8);
      std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )__first._M_current,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )info.super_tagbstring.data);
      uVar2 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      uVar4 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      usprintf(&local_f8,
               "Full size: %Xh (%u)\nType: %Xh\nHash algorithm: %Xh\nHash size: %Xh (%u)\nMetadata size: %Xh (%u)\nMetadata hash: "
               ,(ulong)uVar2,(ulong)uVar4,(ulong)(byte)pcVar5[0xc],(ulong)(byte)pcVar5[0xd]);
      UByteArray::toHex(&local_130,(UByteArray *)local_b8);
      pcVar5 = UByteArray::constData(&local_130);
      Bstrlib::CBString::CBString(&local_110,pcVar5);
      Bstrlib::CBString::operator+((CBString *)local_e0,&local_f8,&local_110);
      Bstrlib::CBString::~CBString(&local_110);
      UByteArray::~UByteArray(&local_130);
      Bstrlib::CBString::~CBString(&local_f8);
      this_00 = this->model;
      Bstrlib::CBString::CBString(&local_148);
      UByteArray::UByteArray(&local_168);
      UByteArray::UByteArray(&local_188);
      TreeModel::addItem(&local_1a0,this_00,local_44,'c','\0',
                         (CBString *)((long)&hash.d.field_2 + 8),&local_148,(CBString *)local_e0,
                         &local_168,(UByteArray *)&name.super_tagbstring.data,&local_188,Fixed,
                         (UModelIndex *)body.d.field_2._8_8_,'\0');
      UByteArray::~UByteArray(&local_188);
      UByteArray::~UByteArray(&local_168);
      Bstrlib::CBString::~CBString(&local_148);
      iVar3 = UByteArray::size((UByteArray *)&name.super_tagbstring.data);
      local_44 = iVar3 + local_44;
      Bstrlib::CBString::~CBString((CBString *)local_e0);
      UByteArray::~UByteArray((UByteArray *)local_b8);
      Bstrlib::CBString::~CBString((CBString *)((long)&hash.d.field_2 + 8));
      UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
    }
    this_local = (FfsParser *)0x0;
    UByteArray::~UByteArray((UByteArray *)local_40);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseSignedPackageInfoData(const UModelIndex & index)
{
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    UByteArray body = model->body(index);
    UINT32 offset = 0;
    while (offset < (UINT32)body.size()) {
        const CPD_EXT_SIGNED_PACKAGE_INFO_MODULE* moduleHeader = (const CPD_EXT_SIGNED_PACKAGE_INFO_MODULE*)(body.constData() + offset);
        if (sizeof(CPD_EXT_SIGNED_PACKAGE_INFO_MODULE) <= ((UINT32)body.size() - offset)) {
            // TODO: check sanity of moduleHeader->HashSize
            UByteArray module((const char*)moduleHeader, CpdExtSignedPkgMetadataHashOffset + moduleHeader->HashSize);
            UString name = usprintf("%.12s", moduleHeader->Name);
            
            // This hash is stored reversed
            // Need to reverse it back to normal
            UByteArray hash((const char*)moduleHeader + CpdExtSignedPkgMetadataHashOffset, moduleHeader->HashSize);
            std::reverse(hash.begin(), hash.end());
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh\nHash algorithm: %Xh\nHash size: %Xh (%u)\nMetadata size: %Xh (%u)\nMetadata hash: ",
                                    (UINT32)module.size(), (UINT32)module.size(),
                                    moduleHeader->Type,
                                    moduleHeader->HashAlgorithm,
                                    moduleHeader->HashSize, moduleHeader->HashSize,
                                    moduleHeader->MetadataSize, moduleHeader->MetadataSize) + UString(hash.toHex().constData());
            // Add tree otem
            model->addItem(offset, Types::CpdSpiEntry, 0, name, UString(), info, UByteArray(), module, UByteArray(), Fixed, index);
            offset += module.size();
        }
        else break;
        // TODO: add padding at the end
    }
    
    return U_SUCCESS;
}